

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall
QTreeViewPrivate::insertViewItems(QTreeViewPrivate *this,int pos,int count,QTreeViewItem *viewItem)

{
  long lVar1;
  pointer pQVar2;
  int *piVar3;
  long lVar4;
  
  QList<QTreeViewItem>::insert(&this->viewItems,(long)pos,(long)count,viewItem);
  pQVar2 = QList<QTreeViewItem>::data(&this->viewItems);
  lVar1 = (this->viewItems).d.size;
  lVar4 = (long)(count + pos);
  piVar3 = &pQVar2[lVar4].parentItem;
  for (; lVar4 < lVar1; lVar4 = lVar4 + 1) {
    if (pos <= *piVar3) {
      *piVar3 = *piVar3 + count;
    }
    piVar3 = piVar3 + 10;
  }
  return;
}

Assistant:

void QTreeViewPrivate::insertViewItems(int pos, int count, const QTreeViewItem &viewItem)
{
    viewItems.insert(pos, count, viewItem);
    QTreeViewItem *items = viewItems.data();
    for (int i = pos + count; i < viewItems.size(); i++)
        if (items[i].parentItem >= pos)
            items[i].parentItem += count;
}